

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_cursor<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
reset<std::__cxx11::istringstream&>
          (basic_bson_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source,
          error_code *ec)

{
  ulong uVar1;
  undefined8 in_RDX;
  long *in_RDI;
  basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000178;
  basic_bson_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>
  *in_stack_00000180;
  
  basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  reset<std::__cxx11::istringstream&>(in_stack_00000180,in_stack_00000178);
  basic_staj_visitor<char>::reset((basic_staj_visitor<char> *)this);
  *(undefined1 *)(in_RDI + 0x53) = 0;
  uVar1 = (**(code **)(*in_RDI + 0x18))();
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RDI + 0x40))(in_RDI,in_RDX);
  }
  return;
}

Assistant:

void reset(Sourceable&& source, std::error_code& ec)
    {
        parser_.reset(std::forward<Sourceable>(source));
        cursor_visitor_.reset();
        eof_ = false;
        if (!done())
        {
            next(ec);
        }
    }